

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O0

uint __thiscall
llvm::DWARFVerifier::verifyAppleAccelTable
          (DWARFVerifier *this,DWARFSection *AccelSection,DataExtractor *StrData,char *SectionName)

{
  DataExtractor *Section;
  bool bVar1;
  Tag TVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  DWARFObject *Obj;
  raw_ostream *prVar5;
  size_t sVar6;
  Error *E_00;
  unsigned_long *Vals_1;
  pair<unsigned_long,_llvm::dwarf::Tag> pVar7;
  DWARFDie DVar8;
  StringRef SVar9;
  raw_ostream *in_stack_fffffffffffffbc0;
  uint local_3c8;
  format_object<const_char_*,_unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int,_unsigned_long,_unsigned_int,_unsigned_long,_const_char_*>
  local_2b0;
  char *local_268;
  char *Name;
  undefined1 auStack_258 [4];
  uint32_t BucketIdx_1;
  DWARFDie Die;
  pair<unsigned_long,_llvm::dwarf::Tag> local_228;
  uint local_214;
  uint local_210;
  uint32_t HashDataIdx;
  uint32_t NumHashDataObjects;
  uint Tag;
  uint64_t Offset;
  uint64_t uStack_1f8;
  uint32_t StringCount;
  uint64_t StringOffset;
  uint64_t StrpOffset;
  ulong local_1c8;
  uint64_t HashDataOffset;
  uint64_t uStack_1b8;
  uint32_t Hash;
  uint64_t DataOffset;
  uint64_t HashOffset;
  undefined1 auStack_1a0 [4];
  uint32_t HashIdx_1;
  size_type local_198;
  int local_18c;
  undefined1 local_188 [4];
  uint32_t NumAtoms;
  uint32_t local_170;
  uint local_16c;
  uint32_t HashIdx;
  uint32_t BucketIdx;
  uint64_t OffsetsBase;
  uint64_t HashesBase;
  uint64_t BucketsOffset;
  uint32_t NumHashes;
  uint32_t NumBuckets;
  string local_140;
  undefined1 local_120 [8];
  Error E;
  AppleAcceleratorTable AccelTable;
  DWARFDataExtractor AccelSectionData;
  char *pcStack_30;
  uint NumErrors;
  char *SectionName_local;
  DataExtractor *StrData_local;
  DWARFSection *AccelSection_local;
  DWARFVerifier *this_local;
  
  AccelSectionData.Section._4_4_ = 0;
  pcStack_30 = SectionName;
  SectionName_local = (char *)StrData;
  StrData_local = (DataExtractor *)AccelSection;
  AccelSection_local = (DWARFSection *)this;
  Obj = DWARFContext::getDWARFObj(this->DCtx);
  Section = StrData_local;
  bVar1 = DWARFContext::isLittleEndian(this->DCtx);
  Vals_1 = (unsigned_long *)0x0;
  DWARFDataExtractor::DWARFDataExtractor
            ((DWARFDataExtractor *)&AccelTable.IsValid,Obj,(DWARFSection *)Section,bVar1,'\0');
  AppleAcceleratorTable::AppleAcceleratorTable
            ((AppleAcceleratorTable *)&stack0xffffffffffffff10,
             (DWARFDataExtractor *)&AccelTable.IsValid,*(DataExtractor *)SectionName_local);
  prVar5 = raw_ostream::operator<<(this->OS,"Verifying ");
  prVar5 = raw_ostream::operator<<(prVar5,pcStack_30);
  raw_ostream::operator<<(prVar5,"...\n");
  uVar3 = AppleAcceleratorTable::getSizeHdr((AppleAcceleratorTable *)&stack0xffffffffffffff10);
  bVar1 = DataExtractor::isValidOffset((DataExtractor *)&AccelTable.IsValid,(ulong)uVar3);
  if (bVar1) {
    AppleAcceleratorTable::extract((AppleAcceleratorTable *)local_120);
    E.Payload._0_1_ = Error::operator_cast_to_bool((Error *)local_120);
    if (E.Payload._0_1_) {
      prVar5 = error(this);
      Error::Error((Error *)&NumHashes,(Error *)local_120);
      toString_abi_cxx11_(&local_140,(llvm *)&NumHashes,E_00);
      prVar5 = raw_ostream::operator<<(prVar5,&local_140);
      raw_ostream::operator<<(prVar5,'\n');
      std::__cxx11::string::~string((string *)&local_140);
      Error::~Error((Error *)&NumHashes);
      this_local._4_4_ = 1;
    }
    E.Payload._1_3_ = 0;
    Error::~Error((Error *)local_120);
    if ((uint)E.Payload == 0) {
      BucketsOffset._4_4_ =
           AppleAcceleratorTable::getNumBuckets((AppleAcceleratorTable *)&stack0xffffffffffffff10);
      BucketsOffset._0_4_ =
           AppleAcceleratorTable::getNumHashes((AppleAcceleratorTable *)&stack0xffffffffffffff10);
      uVar3 = AppleAcceleratorTable::getSizeHdr((AppleAcceleratorTable *)&stack0xffffffffffffff10);
      uVar4 = AppleAcceleratorTable::getHeaderDataLength
                        ((AppleAcceleratorTable *)&stack0xffffffffffffff10);
      HashesBase = (uint64_t)(uVar3 + uVar4);
      OffsetsBase = HashesBase + (BucketsOffset._4_4_ << 2);
      _HashIdx = OffsetsBase + ((uint32_t)BucketsOffset << 2);
      for (local_16c = 0; local_16c < BucketsOffset._4_4_; local_16c = local_16c + 1) {
        local_170 = DataExtractor::getU32
                              ((DataExtractor *)&AccelTable.IsValid,&HashesBase,(Error *)0x0);
        if (((uint32_t)BucketsOffset <= local_170) && (local_170 != 0xffffffff)) {
          prVar5 = error(this);
          format<unsigned_int,unsigned_int>
                    ((format_object<unsigned_int,_unsigned_int> *)local_188,
                     (llvm *)"Bucket[%d] has invalid hash index: %u.\n",(char *)&local_16c,
                     &local_170,(uint *)Vals_1);
          raw_ostream::operator<<(prVar5,(format_object_base *)local_188);
          AccelSectionData.Section._4_4_ = AccelSectionData.Section._4_4_ + 1;
        }
      }
      _auStack_1a0 = AppleAcceleratorTable::getAtomsDesc
                               ((AppleAcceleratorTable *)&stack0xffffffffffffff10);
      sVar6 = ArrayRef<std::pair<unsigned_short,_llvm::dwarf::Form>_>::size
                        ((ArrayRef<std::pair<unsigned_short,_llvm::dwarf::Form>_> *)auStack_1a0);
      local_18c = (int)sVar6;
      if (local_18c == 0) {
        prVar5 = error(this);
        raw_ostream::operator<<(prVar5,"No atoms: failed to read HashData.\n");
        this_local._4_4_ = 1;
        E.Payload._0_4_ = 1;
      }
      else {
        bVar1 = AppleAcceleratorTable::validateForms
                          ((AppleAcceleratorTable *)&stack0xffffffffffffff10);
        if (bVar1) {
          for (HashOffset._4_4_ = 0; HashOffset._4_4_ < (uint32_t)BucketsOffset;
              HashOffset._4_4_ = HashOffset._4_4_ + 1) {
            DataOffset = OffsetsBase + (HashOffset._4_4_ << 2);
            uStack_1b8 = _HashIdx + (ulong)(HashOffset._4_4_ << 2);
            HashDataOffset._4_4_ =
                 DataExtractor::getU32
                           ((DataExtractor *)&AccelTable.IsValid,&DataOffset,(Error *)0x0);
            uVar3 = DataExtractor::getU32
                              ((DataExtractor *)&AccelTable.IsValid,&stack0xfffffffffffffe48,
                               (Error *)0x0);
            local_1c8 = (ulong)uVar3;
            bVar1 = DataExtractor::isValidOffsetForDataOfSize
                              ((DataExtractor *)&AccelTable.IsValid,local_1c8,8);
            if (!bVar1) {
              prVar5 = error(this);
              format<unsigned_int,unsigned_long>
                        ((format_object<unsigned_int,_unsigned_long> *)&StrpOffset,
                         (llvm *)"Hash[%d] has invalid HashData offset: 0x%08lx.\n",
                         (char *)((long)&HashOffset + 4),(uint *)&local_1c8,Vals_1);
              raw_ostream::operator<<(prVar5,(format_object_base *)&StrpOffset);
              AccelSectionData.Section._4_4_ = AccelSectionData.Section._4_4_ + 1;
            }
            Offset._4_4_ = 0;
            while( true ) {
              uVar3 = DataExtractor::getU32
                                ((DataExtractor *)&AccelTable.IsValid,&local_1c8,(Error *)0x0);
              StringOffset = (uint64_t)uVar3;
              if (StringOffset == 0) break;
              local_210 = DataExtractor::getU32
                                    ((DataExtractor *)&AccelTable.IsValid,&local_1c8,(Error *)0x0);
              for (local_214 = 0; local_214 < local_210; local_214 = local_214 + 1) {
                pVar7 = AppleAcceleratorTable::readAtoms
                                  ((AppleAcceleratorTable *)&stack0xffffffffffffff10,&local_1c8);
                local_228.first = pVar7.first;
                local_228.second = pVar7.second;
                std::tie<unsigned_long,unsigned_int>((unsigned_long *)&Die.Die,&NumHashDataObjects);
                std::tuple<unsigned_long&,unsigned_int&>::operator=
                          ((tuple<unsigned_long&,unsigned_int&> *)&Die.Die,&local_228);
                DVar8 = DWARFContext::getDIEForOffset(this->DCtx,_NumHashDataObjects);
                Die.U = (DWARFUnit *)DVar8.Die;
                _auStack_258 = DVar8.U;
                bVar1 = DWARFDie::operator_cast_to_bool((DWARFDie *)auStack_258);
                if (bVar1) {
                  if (HashDataIdx != 0) {
                    TVar2 = DWARFDie::getTag((DWARFDie *)auStack_258);
                    if (TVar2 != HashDataIdx) {
                      prVar5 = error(this);
                      prVar5 = raw_ostream::operator<<(prVar5,"Tag ");
                      SVar9 = dwarf::TagString(HashDataIdx);
                      prVar5 = raw_ostream::operator<<(prVar5,SVar9);
                      prVar5 = raw_ostream::operator<<
                                         (prVar5," in accelerator table does not match Tag ");
                      TVar2 = DWARFDie::getTag((DWARFDie *)auStack_258);
                      SVar9 = dwarf::TagString((uint)TVar2);
                      prVar5 = raw_ostream::operator<<(prVar5,SVar9);
                      prVar5 = raw_ostream::operator<<(prVar5," of DIE[");
                      in_stack_fffffffffffffbc0 = raw_ostream::operator<<(prVar5,local_214);
                      raw_ostream::operator<<(in_stack_fffffffffffffbc0,"].\n");
                      AccelSectionData.Section._4_4_ = AccelSectionData.Section._4_4_ + 1;
                    }
                  }
                }
                else {
                  if (BucketsOffset._4_4_ == 0) {
                    local_3c8 = 0xffffffff;
                  }
                  else {
                    local_3c8 = HashDataOffset._4_4_ % BucketsOffset._4_4_;
                  }
                  Name._4_4_ = local_3c8;
                  uStack_1f8 = StringOffset;
                  local_268 = DataExtractor::getCStr
                                        ((DataExtractor *)SectionName_local,&stack0xfffffffffffffe08
                                        );
                  if (local_268 == (char *)0x0) {
                    local_268 = "<NULL>";
                  }
                  prVar5 = error(this);
                  Vals_1 = (unsigned_long *)((long)&HashOffset + 4);
                  format<char_const*,unsigned_int,unsigned_int,unsigned_int,unsigned_int,unsigned_long,unsigned_int,unsigned_long,char_const*>
                            (&local_2b0,
                             (llvm *)
                             "%s Bucket[%d] Hash[%d] = 0x%08x Str[%u] = 0x%08lx DIE[%d] = 0x%08lx is not a valid DIE offset for \"%s\".\n"
                             ,(char *)&stack0xffffffffffffffd0,(char **)((long)&Name + 4),
                             (uint *)Vals_1,(uint *)((long)&HashDataOffset + 4),
                             (uint *)((long)&Offset + 4),(uint *)&StringOffset,
                             (unsigned_long *)&local_214,&NumHashDataObjects,
                             (unsigned_long *)&local_268,(char **)in_stack_fffffffffffffbc0);
                  raw_ostream::operator<<(prVar5,&local_2b0.super_format_object_base);
                  AccelSectionData.Section._4_4_ = AccelSectionData.Section._4_4_ + 1;
                }
              }
              Offset._4_4_ = Offset._4_4_ + 1;
            }
          }
          this_local._4_4_ = AccelSectionData.Section._4_4_;
          E.Payload._0_4_ = 1;
        }
        else {
          prVar5 = error(this);
          raw_ostream::operator<<(prVar5,"Unsupported form: failed to read HashData.\n");
          this_local._4_4_ = 1;
          E.Payload._0_4_ = 1;
        }
      }
    }
  }
  else {
    prVar5 = error(this);
    raw_ostream::operator<<(prVar5,"Section is too small to fit a section header.\n");
    this_local._4_4_ = 1;
    E.Payload._0_4_ = 1;
  }
  AppleAcceleratorTable::~AppleAcceleratorTable((AppleAcceleratorTable *)&stack0xffffffffffffff10);
  return this_local._4_4_;
}

Assistant:

unsigned DWARFVerifier::verifyAppleAccelTable(const DWARFSection *AccelSection,
                                              DataExtractor *StrData,
                                              const char *SectionName) {
  unsigned NumErrors = 0;
  DWARFDataExtractor AccelSectionData(DCtx.getDWARFObj(), *AccelSection,
                                      DCtx.isLittleEndian(), 0);
  AppleAcceleratorTable AccelTable(AccelSectionData, *StrData);

  OS << "Verifying " << SectionName << "...\n";

  // Verify that the fixed part of the header is not too short.
  if (!AccelSectionData.isValidOffset(AccelTable.getSizeHdr())) {
    error() << "Section is too small to fit a section header.\n";
    return 1;
  }

  // Verify that the section is not too short.
  if (Error E = AccelTable.extract()) {
    error() << toString(std::move(E)) << '\n';
    return 1;
  }

  // Verify that all buckets have a valid hash index or are empty.
  uint32_t NumBuckets = AccelTable.getNumBuckets();
  uint32_t NumHashes = AccelTable.getNumHashes();

  uint64_t BucketsOffset =
      AccelTable.getSizeHdr() + AccelTable.getHeaderDataLength();
  uint64_t HashesBase = BucketsOffset + NumBuckets * 4;
  uint64_t OffsetsBase = HashesBase + NumHashes * 4;
  for (uint32_t BucketIdx = 0; BucketIdx < NumBuckets; ++BucketIdx) {
    uint32_t HashIdx = AccelSectionData.getU32(&BucketsOffset);
    if (HashIdx >= NumHashes && HashIdx != UINT32_MAX) {
      error() << format("Bucket[%d] has invalid hash index: %u.\n", BucketIdx,
                        HashIdx);
      ++NumErrors;
    }
  }
  uint32_t NumAtoms = AccelTable.getAtomsDesc().size();
  if (NumAtoms == 0) {
    error() << "No atoms: failed to read HashData.\n";
    return 1;
  }
  if (!AccelTable.validateForms()) {
    error() << "Unsupported form: failed to read HashData.\n";
    return 1;
  }

  for (uint32_t HashIdx = 0; HashIdx < NumHashes; ++HashIdx) {
    uint64_t HashOffset = HashesBase + 4 * HashIdx;
    uint64_t DataOffset = OffsetsBase + 4 * HashIdx;
    uint32_t Hash = AccelSectionData.getU32(&HashOffset);
    uint64_t HashDataOffset = AccelSectionData.getU32(&DataOffset);
    if (!AccelSectionData.isValidOffsetForDataOfSize(HashDataOffset,
                                                     sizeof(uint64_t))) {
      error() << format("Hash[%d] has invalid HashData offset: "
                        "0x%08" PRIx64 ".\n",
                        HashIdx, HashDataOffset);
      ++NumErrors;
    }

    uint64_t StrpOffset;
    uint64_t StringOffset;
    uint32_t StringCount = 0;
    uint64_t Offset;
    unsigned Tag;
    while ((StrpOffset = AccelSectionData.getU32(&HashDataOffset)) != 0) {
      const uint32_t NumHashDataObjects =
          AccelSectionData.getU32(&HashDataOffset);
      for (uint32_t HashDataIdx = 0; HashDataIdx < NumHashDataObjects;
           ++HashDataIdx) {
        std::tie(Offset, Tag) = AccelTable.readAtoms(&HashDataOffset);
        auto Die = DCtx.getDIEForOffset(Offset);
        if (!Die) {
          const uint32_t BucketIdx =
              NumBuckets ? (Hash % NumBuckets) : UINT32_MAX;
          StringOffset = StrpOffset;
          const char *Name = StrData->getCStr(&StringOffset);
          if (!Name)
            Name = "<NULL>";

          error() << format(
              "%s Bucket[%d] Hash[%d] = 0x%08x "
              "Str[%u] = 0x%08" PRIx64 " DIE[%d] = 0x%08" PRIx64 " "
              "is not a valid DIE offset for \"%s\".\n",
              SectionName, BucketIdx, HashIdx, Hash, StringCount, StrpOffset,
              HashDataIdx, Offset, Name);

          ++NumErrors;
          continue;
        }
        if ((Tag != dwarf::DW_TAG_null) && (Die.getTag() != Tag)) {
          error() << "Tag " << dwarf::TagString(Tag)
                  << " in accelerator table does not match Tag "
                  << dwarf::TagString(Die.getTag()) << " of DIE[" << HashDataIdx
                  << "].\n";
          ++NumErrors;
        }
      }
      ++StringCount;
    }
  }
  return NumErrors;
}